

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alprd_scan.hpp
# Opt level: O2

void __thiscall
duckdb::AlpRDScanState<float>::LoadVector<true>
          (AlpRDScanState<float> *this,EXACT_TYPE *value_buffer)

{
  uint16_t *puVar1;
  ushort uVar2;
  data_ptr_t pdVar3;
  ulong uVar4;
  idx_t __n;
  idx_t iVar5;
  data_ptr_t pdVar6;
  
  (this->vector_state).index = 0;
  pdVar3 = this->metadata_ptr;
  pdVar6 = this->segment_data;
  this->metadata_ptr = pdVar3 + -4;
  uVar4 = (ulong)*(uint *)(pdVar3 + -4);
  iVar5 = this->count - this->total_value_count;
  if (0x3ff < iVar5) {
    iVar5 = 0x400;
  }
  puVar1 = (uint16_t *)(pdVar6 + uVar4);
  (this->vector_state).exceptions_count = *puVar1;
  __n = BitpackingPrimitives::GetRequiredSize(iVar5,(this->vector_state).left_bit_width);
  iVar5 = BitpackingPrimitives::GetRequiredSize(iVar5,(this->vector_state).right_bit_width);
  switchD_01939fa4::default((this->vector_state).left_encoded,puVar1 + 1,__n);
  pdVar6 = pdVar6 + __n + uVar4 + 2;
  switchD_01939fa4::default((this->vector_state).right_encoded,pdVar6,iVar5);
  uVar2 = (this->vector_state).exceptions_count;
  if (uVar2 != 0) {
    switchD_01939fa4::default
              ((this->vector_state).exceptions,pdVar6 + iVar5,(ulong)((uint)uVar2 * 2));
    uVar4 = (ulong)((uint)(this->vector_state).exceptions_count * 2);
    switchD_01939fa4::default
              ((this->vector_state).exceptions_positions,pdVar6 + iVar5 + uVar4,uVar4);
    return;
  }
  return;
}

Assistant:

void LoadVector(EXACT_TYPE *value_buffer) {
		vector_state.Reset();

		// Load the offset (metadata) indicating where the vector data starts
		metadata_ptr -= AlpRDConstants::METADATA_POINTER_SIZE;
		auto data_byte_offset = Load<uint32_t>(metadata_ptr);
		D_ASSERT(data_byte_offset < segment.GetBlockManager().GetBlockSize());

		idx_t vector_size = MinValue((idx_t)AlpRDConstants::ALP_VECTOR_SIZE, (count - total_value_count));

		data_ptr_t vector_ptr = segment_data + data_byte_offset;

		// Load the vector data
		vector_state.exceptions_count = Load<uint16_t>(vector_ptr);
		vector_ptr += AlpRDConstants::EXCEPTIONS_COUNT_SIZE;
		D_ASSERT(vector_state.exceptions_count <= vector_size);

		auto left_bp_size = BitpackingPrimitives::GetRequiredSize(vector_size, vector_state.left_bit_width);
		auto right_bp_size = BitpackingPrimitives::GetRequiredSize(vector_size, vector_state.right_bit_width);

		memcpy(vector_state.left_encoded, (void *)vector_ptr, left_bp_size);
		vector_ptr += left_bp_size;

		memcpy(vector_state.right_encoded, (void *)vector_ptr, right_bp_size);
		vector_ptr += right_bp_size;

		if (vector_state.exceptions_count > 0) {
			memcpy(vector_state.exceptions, (void *)vector_ptr,
			       AlpRDConstants::EXCEPTION_SIZE * vector_state.exceptions_count);
			vector_ptr += AlpRDConstants::EXCEPTION_SIZE * vector_state.exceptions_count;
			memcpy(vector_state.exceptions_positions, (void *)vector_ptr,
			       AlpRDConstants::EXCEPTION_POSITION_SIZE * vector_state.exceptions_count);
		}

		// Decode all the vector values to the specified 'value_buffer'
		vector_state.template LoadValues<SKIP>(value_buffer, vector_size);
	}